

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O0

void re2::SingleThreadedSearchDFA(void)

{
  Prog *pPVar1;
  Regexp *pRVar2;
  ostream *poVar3;
  LogMessage local_a00;
  LogMessage local_880;
  StringPiece local_700;
  StringPiece local_6f0;
  LogMessage local_6e0;
  LogMessage local_560;
  StringPiece local_3e0;
  StringPiece local_3d0;
  bool local_3be;
  byte local_3bd;
  int local_3bc;
  undefined1 local_3b8 [2];
  bool failed;
  bool matched;
  int i;
  Prog *local_238;
  Prog *prog;
  longlong lStack_228;
  MallocCounter m;
  int64 peak_usage;
  int64 usage;
  string match;
  re2 local_1f8 [8];
  string no_match;
  LogMessage local_1d8;
  string local_48 [32];
  StringPiece local_28;
  Regexp *local_18;
  Regexp *re;
  int n;
  
  re._4_4_ = 0x12;
  StringPrintf_abi_cxx11_((char *)local_48,"0[01]{%d}$",0x12);
  StringPiece::StringPiece(&local_28,local_48);
  pRVar2 = Regexp::Parse(&local_28,LikePerl,(RegexpStatus *)0x0);
  std::__cxx11::string::~string((string *)local_48);
  local_18 = pRVar2;
  if (pRVar2 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0xbe);
    poVar3 = LogMessage::stream(&local_1d8);
    std::operator<<(poVar3,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  DeBruijnString_abi_cxx11_(local_1f8,0x12);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&usage,
                 (char *)local_1f8);
  FLAGS_re2_dfa_bail_when_slow = 0;
  testing::MallocCounter::MallocCounter((MallocCounter *)((long)&prog + 7),0);
  local_238 = Regexp::CompileToProg(local_18,0x40000);
  if (local_238 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_3b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0xd2);
    poVar3 = LogMessage::stream((LogMessage *)local_3b8);
    std::operator<<(poVar3,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_3b8);
  }
  for (local_3bc = 0; pPVar1 = local_238, local_3bc < 10; local_3bc = local_3bc + 1) {
    local_3be = false;
    StringPiece::StringPiece(&local_3d0,(string *)&usage);
    StringPiece::StringPiece(&local_3e0,(char *)0x0);
    local_3bd = Prog::SearchDFA(pPVar1,&local_3d0,&local_3e0,kUnanchored,kFirstMatch,
                                (StringPiece *)0x0,&local_3be,
                                (vector<int,_std::allocator<int>_> *)0x0);
    if ((local_3be & 1U) != 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_560,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xd8);
      poVar3 = LogMessage::stream(&local_560);
      std::operator<<(poVar3,"Check failed: !failed");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_560);
    }
    if ((local_3bd & 1) == 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_6e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xd9);
      poVar3 = LogMessage::stream(&local_6e0);
      std::operator<<(poVar3,"Check failed: matched");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6e0);
    }
    pPVar1 = local_238;
    StringPiece::StringPiece(&local_6f0,(string *)local_1f8);
    StringPiece::StringPiece(&local_700,(char *)0x0);
    local_3bd = Prog::SearchDFA(pPVar1,&local_6f0,&local_700,kUnanchored,kFirstMatch,
                                (StringPiece *)0x0,&local_3be,
                                (vector<int,_std::allocator<int>_> *)0x0);
    if ((local_3be & 1U) != 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_880,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xdd);
      poVar3 = LogMessage::stream(&local_880);
      std::operator<<(poVar3,"Check failed: !failed");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_880);
    }
    if ((local_3bd & 1) != 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a00,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xde);
      poVar3 = LogMessage::stream(&local_a00);
      std::operator<<(poVar3,"Check failed: !matched");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a00);
    }
  }
  testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&prog + 7));
  lStack_228 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&prog + 7));
  pPVar1 = local_238;
  if (local_238 != (Prog *)0x0) {
    Prog::~Prog(local_238);
    operator_delete(pPVar1);
  }
  std::__cxx11::string::~string((string *)&usage);
  std::__cxx11::string::~string((string *)local_1f8);
  return;
}

Assistant:

TEST(SingleThreaded, SearchDFA) {
  // Choice of n is mostly arbitrary, except that:
  //   * making n too big makes the test run for too long.
  //   * making n too small makes the DFA refuse to run,
  //     because it has so little memory compared to the program size.
  // Empirically, n = 18 is a good compromise between the two.
  const int n = 18;

  Regexp* re = Regexp::Parse(StringPrintf("0[01]{%d}$", n),
                             Regexp::LikePerl, NULL);
  CHECK(re);

  // The De Bruijn string for n ends with a 1 followed by n 0s in a row,
  // which is not a match for 0[01]{n}$.  Adding one more 0 is a match.
  string no_match = DeBruijnString(n);
  string match = no_match + "0";

  // The De Bruijn string is the worst case input for this regexp.
  // By default, the DFA will notice that it is flushing its cache
  // too frequently and will bail out early, so that RE2 can use the
  // NFA implementation instead.  (The DFA loses its speed advantage
  // if it can't get a good cache hit rate.)
  // Tell the DFA to trudge along instead.
  FLAGS_re2_dfa_bail_when_slow = false;

  int64 usage;
  int64 peak_usage;
  {
    testing::MallocCounter m(testing::MallocCounter::THIS_THREAD_ONLY);
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);
    for (int i = 0; i < 10; i++) {
      bool matched, failed = false;
      matched = prog->SearchDFA(match, NULL,
                                Prog::kUnanchored, Prog::kFirstMatch,
                                NULL, &failed, NULL);
      CHECK(!failed);
      CHECK(matched);
      matched = prog->SearchDFA(no_match, NULL,
                                Prog::kUnanchored, Prog::kFirstMatch,
                                NULL, &failed, NULL);
      CHECK(!failed);
      CHECK(!matched);
    }
    usage = m.HeapGrowth();
    peak_usage = m.PeakHeapGrowth();
    delete prog;
  }
  if (!UsingMallocCounter)
    return;
  //LOG(INFO) << "usage " << usage << ", "
  //          << "peak usage " << peak_usage;
  CHECK_LT(usage, 1<<n);
  CHECK_LT(peak_usage, 1<<n);
  re->Decref();
}